

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

UTimeZoneNameTypeIndex icu_63::ZNames::getTZNameTypeIndex(UTimeZoneNameType type)

{
  UTimeZoneNameTypeIndex local_c;
  UTimeZoneNameType type_local;
  
  switch(type) {
  case UTZNM_LONG_GENERIC:
    local_c = UTZNM_INDEX_LONG_GENERIC;
    break;
  case UTZNM_LONG_STANDARD:
    local_c = UTZNM_INDEX_LONG_STANDARD;
    break;
  default:
    local_c = UTZNM_INDEX_UNKNOWN;
    break;
  case UTZNM_LONG_DAYLIGHT:
    local_c = UTZNM_INDEX_LONG_DAYLIGHT;
    break;
  case UTZNM_SHORT_GENERIC:
    local_c = UTZNM_INDEX_SHORT_GENERIC;
    break;
  case UTZNM_SHORT_STANDARD:
    local_c = UTZNM_INDEX_SHORT_STANDARD;
    break;
  case UTZNM_SHORT_DAYLIGHT:
    local_c = UTZNM_INDEX_SHORT_DAYLIGHT;
    break;
  case UTZNM_EXEMPLAR_LOCATION:
    local_c = UTZNM_INDEX_EXEMPLAR_LOCATION;
  }
  return local_c;
}

Assistant:

static UTimeZoneNameTypeIndex getTZNameTypeIndex(UTimeZoneNameType type) {
        switch(type) {
        case UTZNM_EXEMPLAR_LOCATION: return UTZNM_INDEX_EXEMPLAR_LOCATION;
        case UTZNM_LONG_GENERIC: return UTZNM_INDEX_LONG_GENERIC;
        case UTZNM_LONG_STANDARD: return UTZNM_INDEX_LONG_STANDARD;
        case UTZNM_LONG_DAYLIGHT: return UTZNM_INDEX_LONG_DAYLIGHT;
        case UTZNM_SHORT_GENERIC: return UTZNM_INDEX_SHORT_GENERIC;
        case UTZNM_SHORT_STANDARD: return UTZNM_INDEX_SHORT_STANDARD;
        case UTZNM_SHORT_DAYLIGHT: return UTZNM_INDEX_SHORT_DAYLIGHT;
        default: return UTZNM_INDEX_UNKNOWN;
        }
    }